

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QLocale>::reallocate
          (QMovableArrayOps<QLocale> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QLocale>_*,_QLocale_*> pVar1;
  
  pVar1 = QTypedArrayData<QLocale>::reallocateUnaligned
                    ((this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.d,
                     (this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.ptr,
                     alloc,option);
  if (pVar1.second != (QLocale *)0x0) {
    (this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.d = pVar1.first;
    (this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }